

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

Eci * __thiscall
libsgp4::SGP4::FindPositionSGP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  double xinc;
  double dVar1;
  double dVar2;
  SatelliteException *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double omega;
  double dVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  DateTime local_18;
  
  xinc = (this->elements_).inclination_;
  __x = (this->common_consts_).xmdot * tsince + (this->elements_).mean_anomoly_;
  omega = (this->common_consts_).omgdot * tsince + (this->elements_).argument_perigee_;
  dVar8 = (this->elements_).ascending_node_;
  dVar1 = (this->common_consts_).xnodcf;
  dVar2 = (this->common_consts_).xnodot;
  dVar10 = tsince * tsince;
  dVar9 = 1.0 - (this->common_consts_).c1 * tsince;
  dVar7 = (this->elements_).bstar_ * (this->common_consts_).c4 * tsince;
  dVar11 = (this->common_consts_).t2cof * dVar10;
  if (this->use_simple_model_ == false) {
    dVar5 = (this->nearspace_consts_).omgcof;
    dVar4 = (this->common_consts_).eta;
    dVar6 = (this->nearspace_consts_).xmcof;
    dVar3 = cos(__x);
    dVar4 = pow(dVar3 * dVar4 + 1.0,3.0);
    dVar5 = (dVar4 - (this->nearspace_consts_).delmo) * dVar6 + dVar5 * tsince;
    __x = __x + dVar5;
    omega = omega - dVar5;
    dVar6 = dVar10 * tsince;
    dVar9 = ((dVar9 - (this->nearspace_consts_).d2 * dVar10) - (this->nearspace_consts_).d3 * dVar6)
            - (this->nearspace_consts_).d4 * dVar6 * tsince;
    dVar5 = (this->elements_).bstar_;
    dVar4 = (this->nearspace_consts_).c5;
    dVar3 = sin(__x);
    dVar7 = dVar7 + (dVar3 - (this->nearspace_consts_).sinmo) * dVar5 * dVar4;
    dVar11 = dVar11 + dVar6 * (this->nearspace_consts_).t3cof +
                      ((this->nearspace_consts_).t5cof * tsince + (this->nearspace_consts_).t4cof) *
                      dVar6 * tsince;
  }
  dVar7 = (this->elements_).eccentricity_ - dVar7;
  if (-0.001 < dVar7) {
    dVar5 = 1e-06;
    if ((1e-06 <= dVar7) && (dVar5 = dVar7, 0.999999 < dVar7)) {
      dVar5 = 0.999999;
    }
    dVar8 = dVar1 * dVar10 + dVar2 * tsince + dVar8;
    local_18.m_encoded = (long)(tsince * 60000000.0) + (this->elements_).epoch_.m_encoded;
    CalculateFinalPositionVelocity
              (__return_storage_ptr__,&local_18,dVar5,
               (this->elements_).recovered_semi_major_axis_ * dVar9 * dVar9,omega,
               (this->elements_).recovered_mean_motion_ * dVar11 + __x + omega + dVar8,dVar8,xinc,
               (this->common_consts_).xlcof,(this->common_consts_).aycof,
               (this->common_consts_).x3thm1,(this->common_consts_).x1mth2,
               (this->common_consts_).x7thm1,(this->common_consts_).cosio,
               (this->common_consts_).sinio);
    return __return_storage_ptr__;
  }
  this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
  SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  __cxa_throw(this_00,&SatelliteException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eci SGP4::FindPositionSGP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    const double xinc = elements_.Inclination();

    /*
     * update for secular gravity and atmospheric drag
     */
    const double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    const double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    omega = omgadf;
    double xmp = xmdf;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    if (!use_simple_model_)
    {
        const double delomg = nearspace_consts_.omgcof * tsince;
        const double delm = nearspace_consts_.xmcof
            * (pow(1.0 + common_consts_.eta * cos(xmdf), 3.0)
                    - nearspace_consts_.delmo);
        const double temp = delomg + delm;

        xmp += temp;
        omega -= temp;

        const double tcube = tsq * tsince;
        const double tfour = tsince * tcube;

        tempa = tempa - nearspace_consts_.d2 * tsq - nearspace_consts_.d3
            * tcube - nearspace_consts_.d4 * tfour;
        tempe += elements_.BStar() * nearspace_consts_.c5
            * (sin(xmp) - nearspace_consts_.sinmo);
        templ += nearspace_consts_.t3cof * tcube + tfour
            * (nearspace_consts_.t4cof + tsince * nearspace_consts_.t5cof);
    }

    a = elements_.RecoveredSemiMajorAxis() * tempa * tempa;
    e = elements_.Eccentricity() - tempe;
    xl = xmp + omega + xnode + elements_.RecoveredMeanMotion() * templ;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * using calculated values, find position and velocity
     * we can pass in constants from Initialise() as these dont change
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          common_consts_.xlcof,
                                          common_consts_.aycof,
                                          common_consts_.x3thm1,
                                          common_consts_.x1mth2,
                                          common_consts_.x7thm1,
                                          common_consts_.cosio,
                                          common_consts_.sinio);
}